

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_constant_wnaf(secp256k1_scalar *number,int w)

{
  int *piVar1;
  uint64_t uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  uint count;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  int iVar47;
  secp256k1_scalar *scalar;
  secp256k1_scalar *wnaf_00;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  long lVar59;
  uint uVar60;
  secp256k1_scalar t;
  secp256k1_scalar shift;
  secp256k1_scalar scalar_skew;
  int wnaf [256];
  secp256k1_scalar local_508;
  secp256k1_scalar local_4e8;
  ulong local_4c0;
  secp256k1_scalar local_4b8;
  ulong local_498;
  ulong local_490;
  ulong uStack_488;
  ulong local_480;
  secp256k1_scalar local_478;
  long local_458;
  long local_450;
  undefined1 local_448 [16];
  secp256k1_scalar local_438 [32];
  
  memset(local_438,0,0x400);
  local_508.d[0] = number->d[0];
  local_508.d[2] = number->d[2];
  local_508.d[3] = number->d[3];
  uVar37 = 1 << ((byte)w & 0x1f);
  local_498 = (ulong)uVar37;
  local_4e8.d[0] = 0;
  local_4e8.d[1] = 0;
  local_4e8.d[2] = 0;
  local_4e8.d[3] = 0;
  local_490 = 0;
  uStack_488 = 0;
  local_480 = 0;
  iVar47 = 0x10;
  local_508.d[1] = number->d[1];
  do {
    uVar41 = local_508.d[1];
    local_508.d[0] = local_508.d[0] >> 8 | uVar41 << 0x38;
    local_508.d[1] = uVar41 >> 8 | local_508.d[2] << 0x38;
    local_508.d[2] = local_508.d[2] >> 8 | local_508.d[3] << 0x38;
    local_508.d[3] = local_508.d[3] >> 8;
    iVar47 = iVar47 + -1;
  } while (iVar47 != 0);
  scalar = &local_508;
  wnaf_00 = local_438;
  uVar38 = secp256k1_wnaf_const((int *)wnaf_00,scalar,w,(int)(uVar41 >> 8));
  uVar41 = (long)(w + 0x7f) / (long)w;
  if (-1 < (int)uVar41) {
    uVar41 = uVar41 & 0xffffffff;
    do {
      uVar60 = *(uint *)((long)local_438[0].d + uVar41 * 4);
      if ((ulong)uVar60 == 0) {
        test_constant_wnaf_cold_5();
LAB_00159dcb:
        test_constant_wnaf_cold_4();
LAB_00159dd0:
        test_constant_wnaf_cold_1();
LAB_00159dd5:
        test_constant_wnaf_cold_2();
        goto LAB_00159dda;
      }
      if ((uVar60 & 1) == 0) goto LAB_00159dcb;
      if ((int)uVar60 <= (int)-uVar37) goto LAB_00159dd0;
      if ((int)uVar37 <= (int)uVar60) goto LAB_00159dd5;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_4e8.d[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_498;
      uVar42 = SUB168(auVar4 * auVar20,8);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar42;
      local_478.d[0] = SUB168(auVar4 * auVar20,0);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_4e8.d[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_490;
      auVar5 = auVar5 * auVar21;
      uVar48 = SUB168(auVar5 + auVar36,0);
      uVar53 = SUB168(auVar5 + auVar36,8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_4e8.d[1];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_498;
      uVar43 = SUB168(auVar6 * auVar22,8);
      uVar40 = SUB168(auVar6 * auVar22,0);
      local_478.d[1] = uVar48 + uVar40;
      uVar40 = (ulong)CARRY8(uVar48,uVar40);
      uVar48 = uVar53 + uVar43;
      uVar54 = uVar48 + uVar40;
      uVar55 = (ulong)CARRY8(auVar5._8_8_,(ulong)CARRY8(uVar42,auVar5._0_8_)) +
               (ulong)(CARRY8(uVar53,uVar43) || CARRY8(uVar48,uVar40));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_4e8.d[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uStack_488;
      uVar44 = SUB168(auVar7 * auVar23,8);
      uVar40 = SUB168(auVar7 * auVar23,0);
      uVar42 = uVar54 + uVar40;
      uVar40 = (ulong)CARRY8(uVar54,uVar40);
      uVar43 = uVar55 + uVar44;
      uVar56 = uVar43 + uVar40;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_4e8.d[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_490;
      uVar45 = SUB168(auVar8 * auVar24,8);
      uVar48 = SUB168(auVar8 * auVar24,0);
      uVar54 = uVar42 + uVar48;
      uVar48 = (ulong)CARRY8(uVar42,uVar48);
      uVar53 = uVar56 + uVar45;
      uVar57 = uVar53 + uVar48;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_4e8.d[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_498;
      uVar46 = SUB168(auVar9 * auVar25,8);
      uVar42 = SUB168(auVar9 * auVar25,0);
      local_478.d[2] = uVar54 + uVar42;
      uVar42 = (ulong)CARRY8(uVar54,uVar42);
      uVar54 = uVar57 + uVar46;
      uVar58 = uVar54 + uVar42;
      uVar49 = (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar43,uVar40)) +
               (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar53,uVar48)) +
               (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar54,uVar42));
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_4e8.d[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_480;
      uVar46 = SUB168(auVar10 * auVar26,8);
      uVar40 = SUB168(auVar10 * auVar26,0);
      uVar42 = uVar58 + uVar40;
      uVar40 = (ulong)CARRY8(uVar58,uVar40);
      uVar53 = uVar49 + uVar46;
      uVar58 = uVar53 + uVar40;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_4e8.d[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uStack_488;
      uVar55 = SUB168(auVar11 * auVar27,8);
      uVar48 = SUB168(auVar11 * auVar27,0);
      uVar43 = uVar42 + uVar48;
      uVar48 = (ulong)CARRY8(uVar42,uVar48);
      uVar54 = uVar58 + uVar55;
      uVar50 = uVar54 + uVar48;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_4e8.d[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_490;
      uVar56 = SUB168(auVar12 * auVar28,8);
      uVar42 = SUB168(auVar12 * auVar28,0);
      uVar45 = uVar43 + uVar42;
      uVar42 = (ulong)CARRY8(uVar43,uVar42);
      uVar44 = uVar50 + uVar56;
      uVar51 = uVar44 + uVar42;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_4e8.d[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_498;
      uVar57 = SUB168(auVar13 * auVar29,8);
      uVar43 = SUB168(auVar13 * auVar29,0);
      local_478.d[3] = uVar45 + uVar43;
      uVar43 = (ulong)CARRY8(uVar45,uVar43);
      uVar45 = uVar51 + uVar57;
      uVar52 = uVar45 + uVar43;
      uVar55 = (ulong)(CARRY8(uVar49,uVar46) || CARRY8(uVar53,uVar40)) +
               (ulong)(CARRY8(uVar58,uVar55) || CARRY8(uVar54,uVar48)) +
               (ulong)(CARRY8(uVar50,uVar56) || CARRY8(uVar44,uVar42)) +
               (ulong)(CARRY8(uVar51,uVar57) || CARRY8(uVar45,uVar43));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_4e8.d[1];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_480;
      uVar44 = SUB168(auVar14 * auVar30,8);
      uVar40 = SUB168(auVar14 * auVar30,0);
      uVar42 = uVar52 + uVar40;
      uVar40 = (ulong)CARRY8(uVar52,uVar40);
      uVar43 = uVar55 + uVar44;
      uVar56 = uVar43 + uVar40;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_4e8.d[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uStack_488;
      uVar45 = SUB168(auVar15 * auVar31,8);
      uVar48 = SUB168(auVar15 * auVar31,0);
      uVar54 = uVar42 + uVar48;
      uVar48 = (ulong)CARRY8(uVar42,uVar48);
      uVar53 = uVar56 + uVar45;
      uVar57 = uVar53 + uVar48;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_4e8.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_490;
      uVar46 = SUB168(auVar16 * auVar32,8);
      uVar42 = SUB168(auVar16 * auVar32,0);
      local_458 = uVar54 + uVar42;
      uVar42 = (ulong)CARRY8(uVar54,uVar42);
      uVar54 = uVar57 + uVar46;
      uVar49 = uVar54 + uVar42;
      uVar44 = (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar43,uVar40)) +
               (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar53,uVar48)) +
               (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar54,uVar42));
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_4e8.d[2];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_480;
      uVar53 = SUB168(auVar17 * auVar33,8);
      uVar40 = SUB168(auVar17 * auVar33,0);
      uVar43 = uVar49 + uVar40;
      uVar40 = (ulong)CARRY8(uVar49,uVar40);
      uVar42 = uVar44 + uVar53;
      uVar45 = uVar42 + uVar40;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_4e8.d[3];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uStack_488;
      uVar54 = SUB168(auVar18 * auVar34,8);
      uVar48 = SUB168(auVar18 * auVar34,0);
      local_450 = uVar43 + uVar48;
      uVar48 = (ulong)CARRY8(uVar43,uVar48);
      uVar43 = uVar45 + uVar54;
      local_448._8_8_ =
           (ulong)(CARRY8(uVar44,uVar53) || CARRY8(uVar42,uVar40)) +
           (ulong)(CARRY8(uVar45,uVar54) || CARRY8(uVar43,uVar48));
      local_448._0_8_ = uVar43 + uVar48;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_4e8.d[3];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_480;
      local_448 = auVar19 * auVar35 + local_448;
      scalar = &local_4e8;
      local_4c0 = uVar41;
      secp256k1_scalar_reduce_512(scalar,local_478.d);
      if ((int)uVar60 < 0) {
        local_4b8.d[0] = (uint64_t)-uVar60;
        local_4b8.d[1] = 0;
        local_4b8.d[2] = 0;
        local_4b8.d[3] = 0;
        secp256k1_scalar_negate(&local_4b8,&local_4b8);
      }
      else {
        local_4b8.d[1] = 0;
        local_4b8.d[2] = 0;
        local_4b8.d[3] = 0;
        local_4b8.d[0] = (ulong)uVar60;
      }
      wnaf_00 = scalar;
      secp256k1_scalar_add(scalar,scalar,&local_4b8);
      uVar41 = (ulong)((int)local_4c0 - 1);
    } while (0 < (int)local_4c0);
  }
  local_478.d[0] = (uint64_t)uVar38;
  local_478.d[1] = 0;
  local_478.d[2] = 0;
  local_478.d[3] = 0;
  scalar = &local_508;
  wnaf_00 = scalar;
  secp256k1_scalar_add(scalar,scalar,&local_478);
  if ((((local_4e8.d[0] == local_508.d[0]) && (local_4e8.d[1] == local_508.d[1])) &&
      (local_4e8.d[2] == local_508.d[2])) && (local_4e8.d[3] == local_508.d[3])) {
    return;
  }
LAB_00159dda:
  test_constant_wnaf_cold_3();
  uVar2 = scalar->d[0];
  if (((scalar->d[1] == 0 && scalar->d[2] == 0) && scalar->d[3] == 0) && uVar2 == 0) {
    uVar41 = (long)(int)(count + 0x7f) / (long)(int)count;
    if (0 < (int)uVar41) {
      memset(wnaf_00,0,(uVar41 & 0xffffffff) << 2);
    }
  }
  else {
    uVar37 = secp256k1_scalar_get_bits_var(scalar,0,count);
    *(uint *)wnaf_00->d = uVar37 + (~(uint)uVar2 & 1);
    iVar47 = (int)(count + 0x7f) / (int)count;
    uVar60 = iVar47 - 1;
    uVar41 = (ulong)uVar60;
    uVar37 = uVar60 * count;
    uVar38 = 0x80 - uVar37;
    if (1 < iVar47) {
      lVar59 = 0;
      uVar41 = (ulong)uVar60;
      do {
        uVar39 = count;
        if (lVar59 == 0) {
          uVar39 = uVar38;
        }
        uVar39 = secp256k1_scalar_get_bits_var(scalar,uVar37,uVar39);
        if (uVar39 != 0) goto LAB_00159e97;
        *(undefined4 *)((long)wnaf_00->d + uVar41 * 4) = 0;
        uVar37 = uVar37 - count;
        lVar59 = lVar59 + 1;
        bVar3 = 1 < (long)uVar41;
        uVar41 = uVar41 - 1;
      } while (bVar3);
      uVar41 = 0;
    }
LAB_00159e97:
    if (0 < (int)uVar41) {
      uVar40 = 1;
      uVar37 = count;
      do {
        uVar39 = count;
        if (uVar60 == uVar40) {
          uVar39 = uVar38;
        }
        uVar39 = secp256k1_scalar_get_bits_var(scalar,uVar37,uVar39);
        if ((uVar39 & 1) == 0) {
          piVar1 = (int *)((long)wnaf_00->d + uVar40 * 4 + -4);
          *piVar1 = *piVar1 + (-1 << ((byte)count & 0x1f));
          uVar39 = uVar39 | 1;
        }
        *(uint *)((long)wnaf_00->d + uVar40 * 4) = uVar39;
        if ((1 < uVar40) &&
           (((iVar47 = *(int *)((long)wnaf_00->d + uVar40 * 4 + -4), iVar47 == 1 &&
             (*(int *)((long)wnaf_00->d + uVar40 * 4 + -8) < 0)) ||
            ((iVar47 == -1 && (0 < *(int *)((long)wnaf_00->d + uVar40 * 4 + -8))))))) {
          piVar1 = (int *)((long)wnaf_00->d + uVar40 * 4 + -8);
          *piVar1 = *piVar1 + ((uint)(iVar47 == 1) * 2 + -1 << ((byte)count & 0x1f));
          *(undefined4 *)((long)wnaf_00->d + uVar40 * 4 + -4) = 0;
        }
        uVar40 = uVar40 + 1;
        uVar37 = uVar37 + count;
      } while ((int)uVar41 + 1 != uVar40);
    }
  }
  return;
}

Assistant:

static void test_constant_wnaf(const secp256k1_scalar *number, int w) {
    secp256k1_scalar x, shift;
    int wnaf[256] = {0};
    int i;
    int skew;
    int bits = 256;
    secp256k1_scalar num = *number;
    secp256k1_scalar scalar_skew;

    secp256k1_scalar_set_int(&x, 0);
    secp256k1_scalar_set_int(&shift, 1 << w);
    for (i = 0; i < 16; ++i) {
        secp256k1_scalar_shr_int(&num, 8);
    }
    bits = 128;
    skew = secp256k1_wnaf_const(wnaf, &num, w, bits);

    for (i = WNAF_SIZE_BITS(bits, w); i >= 0; --i) {
        secp256k1_scalar t;
        int v = wnaf[i];
        CHECK(v != 0); /* check nonzero */
        CHECK(v & 1);  /* check parity */
        CHECK(v > -(1 << w)); /* check range above */
        CHECK(v < (1 << w));  /* check range below */

        secp256k1_scalar_mul(&x, &x, &shift);
        if (v >= 0) {
            secp256k1_scalar_set_int(&t, v);
        } else {
            secp256k1_scalar_set_int(&t, -v);
            secp256k1_scalar_negate(&t, &t);
        }
        secp256k1_scalar_add(&x, &x, &t);
    }
    /* Skew num because when encoding numbers as odd we use an offset */
    secp256k1_scalar_set_int(&scalar_skew, skew);
    secp256k1_scalar_add(&num, &num, &scalar_skew);
    CHECK(secp256k1_scalar_eq(&x, &num));
}